

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.hpp
# Opt level: O0

void __thiscall deqp::gls::ShaderExecUtil::ShaderSpec::ShaderSpec(ShaderSpec *this)

{
  ShaderSpec *this_local;
  
  this->version = GLSL_VERSION_300_ES;
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::vector(&this->inputs);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::vector(&this->outputs);
  std::__cxx11::string::string((string *)&this->globalDeclarations);
  std::__cxx11::string::string((string *)&this->source);
  return;
}

Assistant:

ShaderSpec (void) : version(glu::GLSL_VERSION_300_ES) {}